

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header(p_ply ply)

{
  int iVar1;
  p_ply ply_local;
  
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_READ)) {
    iVar1 = ply_read_header_magic(ply);
    if ((iVar1 != 0) && (iVar1 = ply_read_word(ply), iVar1 != 0)) {
      iVar1 = ply_read_header_format(ply);
      if (iVar1 == 0) {
        ply_ferror(ply,"Invalid file format");
      }
      else {
        do {
          iVar1 = strcmp(ply->buffer + ply->buffer_token,"end_header");
          if (iVar1 == 0) {
            if (ply->rn != 0) {
              if ((ply->buffer_last == ply->buffer_first) && (iVar1 = BREFILL(ply), iVar1 == 0)) {
                ply_ferror(ply,"Unexpected end of file");
                return 0;
              }
              ply->buffer_first = ply->buffer_first + 1;
            }
            return 1;
          }
          iVar1 = ply_read_header_comment(ply);
        } while (((iVar1 != 0) || (iVar1 = ply_read_header_element(ply), iVar1 != 0)) ||
                (iVar1 = ply_read_header_obj_info(ply), iVar1 != 0));
        ply_ferror(ply,"Unexpected token \'%s\'",ply->buffer + ply->buffer_token);
      }
    }
    return 0;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,400,"int ply_read_header(p_ply)");
}

Assistant:

int ply_read_header(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (!ply_read_header_magic(ply)) return 0;
    if (!ply_read_word(ply)) return 0;
    /* parse file format */
    if (!ply_read_header_format(ply)) {
        ply_ferror(ply, "Invalid file format");
        return 0;
    }
    /* parse elements, comments or obj_infos until the end of header */
    while (strcmp(BWORD(ply), "end_header")) {
        if (!ply_read_header_comment(ply) &&
                !ply_read_header_element(ply) &&
                !ply_read_header_obj_info(ply)) {
            ply_ferror(ply, "Unexpected token '%s'", BWORD(ply));
            return 0;
        }
    }
    /* skip extra character? */
    if (ply->rn) {
        if (BSIZE(ply) < 1 && !BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
        BSKIP(ply, 1);
    }
    return 1;
}